

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::ParquetMetaDataInit<(duckdb::ParquetMetadataOperatorType)1>
          (duckdb *this,ClientContext *context,TableFunctionInitInput *input)

{
  FunctionData *pFVar1;
  MultiFileList *pMVar2;
  pointer pPVar3;
  pointer *__ptr;
  FunctionData *this_00;
  unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
  local_68;
  OpenFileInfo local_60;
  
  pFVar1 = optional_ptr<const_duckdb::FunctionData,_true>::operator->
                     ((optional_ptr<const_duckdb::FunctionData,_true> *)input);
  make_uniq<duckdb::ParquetMetaDataOperatorData,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>const&>
            ((duckdb *)&local_68,context,(vector<duckdb::LogicalType,_true> *)(pFVar1 + 0x20));
  this_00 = pFVar1 + 0x38;
  pMVar2 = shared_ptr<duckdb::MultiFileList,_true>::operator->
                     ((shared_ptr<duckdb::MultiFileList,_true> *)this_00);
  unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
  ::operator->(&local_68);
  duckdb::MultiFileList::InitializeScan((MultiFileListScanData *)pMVar2);
  pMVar2 = shared_ptr<duckdb::MultiFileList,_true>::operator->
                     ((shared_ptr<duckdb::MultiFileList,_true> *)this_00);
  pPVar3 = unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
           ::operator->(&local_68);
  unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
  ::operator->(&local_68);
  duckdb::MultiFileList::Scan
            ((MultiFileListScanData *)pMVar2,(OpenFileInfo *)&pPVar3->file_list_scan);
  pPVar3 = unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>,_true>
           ::operator->(&local_68);
  shared_ptr<duckdb::MultiFileList,_true>::operator->
            ((shared_ptr<duckdb::MultiFileList,_true> *)this_00);
  duckdb::MultiFileList::GetFirstFile();
  ParquetMetaDataOperatorData::LoadSchemaData
            (pPVar3,context,(vector<duckdb::LogicalType,_true> *)(pFVar1 + 0x20),&local_60);
  OpenFileInfo::~OpenFileInfo(&local_60);
  *(unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>_>
    *)this = local_68.
             super_unique_ptr<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParquetMetaDataOperatorData,_std::default_delete<duckdb::ParquetMetaDataOperatorData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParquetMetaDataOperatorData_*,_std::default_delete<duckdb::ParquetMetaDataOperatorData>_>
             .super__Head_base<0UL,_duckdb::ParquetMetaDataOperatorData_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )this;
}

Assistant:

unique_ptr<GlobalTableFunctionState> ParquetMetaDataInit(ClientContext &context, TableFunctionInitInput &input) {
	auto &bind_data = input.bind_data->Cast<ParquetMetaDataBindData>();

	auto result = make_uniq<ParquetMetaDataOperatorData>(context, bind_data.return_types);

	bind_data.file_list->InitializeScan(result->file_list_scan);
	bind_data.file_list->Scan(result->file_list_scan, result->current_file);

	D_ASSERT(!bind_data.file_list->IsEmpty());

	switch (TYPE) {
	case ParquetMetadataOperatorType::SCHEMA:
		result->LoadSchemaData(context, bind_data.return_types, bind_data.file_list->GetFirstFile());
		break;
	case ParquetMetadataOperatorType::META_DATA:
		result->LoadRowGroupMetadata(context, bind_data.return_types, bind_data.file_list->GetFirstFile());
		break;
	case ParquetMetadataOperatorType::KEY_VALUE_META_DATA:
		result->LoadKeyValueMetaData(context, bind_data.return_types, bind_data.file_list->GetFirstFile());
		break;
	case ParquetMetadataOperatorType::FILE_META_DATA:
		result->LoadFileMetaData(context, bind_data.return_types, bind_data.file_list->GetFirstFile());
		break;
	case ParquetMetadataOperatorType::BLOOM_PROBE: {
		auto &bloom_probe_bind_data = input.bind_data->Cast<ParquetBloomProbeBindData>();
		result->ExecuteBloomProbe(context, bind_data.return_types, bind_data.file_list->GetFirstFile(),
		                          bloom_probe_bind_data.probe_column_name, bloom_probe_bind_data.probe_constant);
		break;
	}
	default:
		throw InternalException("Unsupported ParquetMetadataOperatorType");
	}

	return std::move(result);
}